

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

int add_environment(char *key,char *val)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (*(long *)((long)ENV + lVar3) == 0) {
      sVar1 = strlen(key);
      sVar2 = strlen(val);
      sVar1 = sVar1 + sVar2 + 2;
      __s = (char *)malloc(sVar1);
      snprintf(__s,sVar1,"%s=%s",key,val);
      *(char **)((long)ENV + lVar3) = __s;
      return 0;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0xf8);
  return 1;
}

Assistant:

int add_environment(const char *key, const char *val)
{
    int n;
 
    for (n = 0; n < 31; n++) {
        if (!ENV[n]) {
            size_t len = strlen(key) + strlen(val) + 2;
            char *entry = malloc(len);
            snprintf(entry, len, "%s=%s", key, val);
            ENV[n] = entry;
            return 0;
        }
    }

    return 1;
}